

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O0

UBool isSpecialTypeCodepoints(char *val)

{
  bool local_29;
  char *local_28;
  char *p;
  int32_t subtagLen;
  char *val_local;
  
  p._4_4_ = 0;
  local_28 = val;
  do {
    if (*local_28 == '\0') {
      local_29 = 3 < p._4_4_ && p._4_4_ < 7;
      return local_29;
    }
    if (*local_28 == '-') {
      if ((p._4_4_ < 4) || (6 < p._4_4_)) {
        return '\0';
      }
      p._4_4_ = 0;
    }
    else {
      if ((((*local_28 < '0') || ('9' < *local_28)) && ((*local_28 < 'A' || ('F' < *local_28)))) &&
         ((*local_28 < 'a' || ('f' < *local_28)))) {
        return '\0';
      }
      p._4_4_ = p._4_4_ + 1;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static UBool
isSpecialTypeCodepoints(const char* val) {
    int32_t subtagLen = 0;
    const char* p = val;
    while (*p) {
        if (*p == '-') {
            if (subtagLen < 4 || subtagLen > 6) {
                return FALSE;
            }
            subtagLen = 0;
        } else if ((*p >= '0' && *p <= '9') ||
                    (*p >= 'A' && *p <= 'F') || // A-F/a-f are contiguous
                    (*p >= 'a' && *p <= 'f')) { // also in EBCDIC
            subtagLen++;
        } else {
            return FALSE;
        }
        p++;
    }
    return (subtagLen >= 4 && subtagLen <= 6);
}